

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
* fineftp::Filesystem::dirContent
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
             *__return_storage_ptr__,string *path)

{
  char *pcVar1;
  ostream *poVar2;
  int *piVar3;
  allocator local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  FileStatus local_120;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  dirent *local_30;
  dirent *dirp;
  DIR *dp;
  string *local_18;
  string *path_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
  *content;
  
  dp._7_1_ = 0;
  local_18 = path;
  path_local = (string *)__return_storage_ptr__;
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
  ::map(__return_storage_ptr__);
  pcVar1 = (char *)::std::__cxx11::string::c_str();
  dirp = (dirent *)opendir(pcVar1);
  if (dirp == (dirent *)0x0) {
    poVar2 = ::std::operator<<((ostream *)&::std::cerr,"Error opening directory: ");
    piVar3 = __errno_location();
    pcVar1 = strerror(*piVar3);
    poVar2 = ::std::operator<<(poVar2,pcVar1);
    ::std::ostream::operator<<(poVar2,::std::endl<char,std::char_traits<char>>);
  }
  else {
    while (local_30 = readdir((DIR *)dirp), local_30 != (dirent *)0x0) {
      pcVar1 = local_30->d_name;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_60,pcVar1,&local_61);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_160,(char *)local_18);
      pcVar1 = local_30->d_name;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_180,pcVar1,&local_181);
      ::std::operator+(&local_140,&local_160,&local_180);
      FileStatus::FileStatus(&local_120,&local_140);
      ::std::
      map<std::__cxx11::string,fineftp::Filesystem::FileStatus,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,fineftp::Filesystem::FileStatus>>>
      ::emplace<std::__cxx11::string,fineftp::Filesystem::FileStatus>
                ((map<std::__cxx11::string,fineftp::Filesystem::FileStatus,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,fineftp::Filesystem::FileStatus>>>
                  *)__return_storage_ptr__,&local_60,&local_120);
      FileStatus::~FileStatus(&local_120);
      ::std::__cxx11::string::~string((string *)&local_140);
      ::std::__cxx11::string::~string((string *)&local_180);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_181);
      ::std::__cxx11::string::~string((string *)&local_160);
      ::std::__cxx11::string::~string((string *)&local_60);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
    }
    closedir((DIR *)dirp);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, FileStatus> dirContent(const std::string& path)
  {
    std::map<std::string, FileStatus> content;
#ifdef WIN32
    std::string find_file_path = path + "\\*";
    std::replace(find_file_path.begin(), find_file_path.end(), '/', '\\');

    std::wstring w_find_file_path = StrConvert::Utf8ToWide(find_file_path);

    HANDLE hFind;
    WIN32_FIND_DATAW ffd;
    hFind = FindFirstFileW(w_find_file_path.c_str(), &ffd);
    if (hFind == INVALID_HANDLE_VALUE)
    {
      std::cerr << "FindFirstFile Error" << std::endl;
      return content;
    }

    do
    {
      std::string file_name = StrConvert::WideToUtf8(std::wstring(ffd.cFileName));
      content.emplace(file_name, FileStatus(path + "\\" + file_name));
    } while (FindNextFileW(hFind, &ffd) != 0);
    FindClose(hFind);
#else // WIN32
    DIR *dp;
    struct dirent *dirp;
    if((dp = opendir(path.c_str())) == NULL)
    {
        std::cerr << "Error opening directory: " << strerror(errno) << std::endl;
        return content;
    }

    while ((dirp = readdir(dp)) != NULL)
    {
      content.emplace(std::string(dirp->d_name), FileStatus(path + "/" + std::string(dirp->d_name)));
    }
    closedir(dp);

#endif // WIN32
    return content;
  }